

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

var __thiscall cs::runtime_type::parse_escape(runtime_type *this,var *b)

{
  char *__s1;
  proxy *ppVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined *puVar3;
  pointer *ppVar4;
  runtime_error *prVar5;
  any *in_RDX;
  string local_38;
  
  if (in_RDX->mDat == (proxy *)0x0) {
    puVar3 = &void::typeinfo;
  }
  else {
    iVar2 = (*in_RDX->mDat->data->_vptr_baseHolder[2])();
    puVar3 = (undefined *)CONCAT44(extraout_var,iVar2);
  }
  __s1 = *(char **)(puVar3 + 8);
  if (__s1 != "N2cs7pointerE") {
    if (*__s1 != '*') {
      iVar2 = strcmp(__s1,"N2cs7pointerE");
      if (iVar2 == 0) goto LAB_0015d8b6;
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Unsupported operator operations(Escape).","");
    runtime_error::runtime_error(prVar5,&local_38);
    __cxa_throw(prVar5,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
LAB_0015d8b6:
  ppVar4 = cs_impl::any::const_val<cs::pointer>(in_RDX);
  ppVar1 = (ppVar4->data).mDat;
  if (ppVar1 != (proxy *)0x0) {
    ppVar1->refcount = ppVar1->refcount + 1;
    (this->literals).
    super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .
    super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .ctrl_ = &ppVar1->is_rvalue;
    return (var)(proxy *)this;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Escape from null pointer.","");
  runtime_error::runtime_error(prVar5,&local_38);
  __cxa_throw(prVar5,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var runtime_type::parse_escape(const var &b)
	{
		if (b.type() == typeid(pointer)) {
			const auto &ptr = b.const_val<pointer>();
			if (ptr.data.usable())
				return ptr.data;
			else
				throw runtime_error("Escape from null pointer.");
		}
		else
			throw runtime_error("Unsupported operator operations(Escape).");
	}